

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O0

RK_S32 mpp_hevc_extract_rbsp(HEVCContext *s,RK_U8 *src,int length,HEVCNAL *nal)

{
  RK_U8 *pRVar1;
  int local_34;
  RK_S32 local_30;
  int local_2c;
  RK_S32 min_size;
  RK_S32 i;
  HEVCNAL *nal_local;
  int length_local;
  RK_U8 *src_local;
  HEVCContext *s_local;
  
  s->skipped_bytes = 0;
  local_2c = 0;
  do {
    nal_local._4_4_ = length;
    if (length <= local_2c + 1) {
LAB_001d6d69:
      if (nal->rbsp_buffer_size < nal_local._4_4_ + 8) {
        local_34 = nal_local._4_4_ + 8;
        mpp_osal_free("mpp_hevc_extract_rbsp",nal->rbsp_buffer);
        nal->rbsp_buffer = (RK_U8 *)0x0;
        if (local_34 < (local_34 * 0x11) / 0x10 + 0x20) {
          local_34 = (local_34 * 0x11) / 0x10 + 0x20;
        }
        local_30 = local_34;
        pRVar1 = (RK_U8 *)mpp_osal_malloc("mpp_hevc_extract_rbsp",(long)local_34);
        nal->rbsp_buffer = pRVar1;
        if (nal->rbsp_buffer == (RK_U8 *)0x0) {
          local_30 = 0;
        }
        nal->rbsp_buffer_size = local_30;
      }
      memcpy(nal->rbsp_buffer,src,(long)nal_local._4_4_);
      nal->data = nal->rbsp_buffer;
      nal->size = nal_local._4_4_;
      memset(nal->rbsp_buffer + nal_local._4_4_,0,8);
      return nal_local._4_4_;
    }
    if (((*(uint *)(src + local_2c) ^ 0xffffffff) & *(int *)(src + local_2c) + 0xfefffeffU &
        0x80008080) != 0) {
      if ((0 < local_2c) && (src[local_2c] == '\0')) {
        local_2c = local_2c + -1;
      }
      for (; src[local_2c] != '\0'; local_2c = local_2c + 1) {
      }
      if (((local_2c + 2 < length) && (src[local_2c + 1] == '\0')) && (src[local_2c + 2] < 2)) {
        nal_local._4_4_ = local_2c;
        goto LAB_001d6d69;
      }
      local_2c = local_2c + -3;
    }
    local_2c = local_2c + 5;
  } while( true );
}

Assistant:

RK_S32 mpp_hevc_extract_rbsp(HEVCContext *s, const RK_U8 *src, int length,
                             HEVCNAL *nal)
{
    RK_S32 i;

    s->skipped_bytes = 0;

#define STARTCODE_TEST                                              \
    if (i + 2 < length && src[i + 1] == 0 && src[i + 2] < 2) {      \
            /* startcode, so we must be past the end */             \
        length = i;                                                 \
        break;                                                      \
    }